

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

bool __thiscall Gluco::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  uint uVar1;
  uint *puVar2;
  lbool *plVar3;
  char *pcVar4;
  VarData *pVVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  Lit p_1;
  Lit local_48;
  Lit local_44;
  vec<Gluco::Lit> *local_40;
  long local_38;
  
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_44.x = p.x;
  vec<Gluco::Lit>::push(&this->analyze_stack,&local_44);
  uVar6 = (this->analyze_stack).sz;
  bVar10 = (int)uVar6 < 1;
  if (0 < (int)uVar6) {
    local_40 = &this->analyze_toclear;
    local_38 = (long)(this->analyze_toclear).sz;
    do {
      uVar1 = (this->vardata).data[(this->analyze_stack).data[(ulong)uVar6 - 1].x >> 1].reason;
      uVar9 = (ulong)uVar1;
      if (uVar9 == 0xffffffff) {
        __assert_fail("reason(var(analyze_stack.last())) != CRef_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x2c7,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
      }
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar1) {
        __assert_fail("r >= 0 && r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                      ,0x42,
                      "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
        ;
      }
      puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      (this->analyze_stack).sz = uVar6 - 1;
      if (puVar2[uVar9 + 1] == 2) {
        uVar6 = puVar2[uVar9 + 3];
        plVar3 = (this->assigns).data;
        if (((byte)uVar6 & 1 ^ plVar3[(int)uVar6 >> 1].value) == 1) {
          uVar1 = puVar2[uVar9 + 4];
          if (plVar3[(int)uVar1 >> 1].value != ((byte)uVar1 & 1)) {
            __assert_fail("value(c[1])==l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                          ,0x2ca,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
          }
          puVar2[uVar9 + 3] = uVar1;
          puVar2[uVar9 + 4] = uVar6;
        }
      }
      if (1 < (int)puVar2[uVar9 + 1]) {
        lVar7 = 4;
        do {
          local_48.x = puVar2[uVar9 + lVar7];
          iVar8 = local_48.x >> 1;
          pcVar4 = (this->seen).data;
          if (pcVar4[iVar8] == '\0') {
            pVVar5 = (this->vardata).data;
            uVar6 = pVVar5[iVar8].level;
            if (0 < (int)uVar6) {
              if ((pVVar5[iVar8].reason == 0xffffffff) ||
                 ((abstract_levels >> (uVar6 & 0x1f) & 1) == 0)) {
                iVar8 = (this->analyze_toclear).sz;
                lVar7 = local_38;
                if ((int)local_38 < iVar8) {
                  do {
                    (this->seen).data[(this->analyze_toclear).data[lVar7].x >> 1] = '\0';
                    lVar7 = lVar7 + 1;
                    iVar8 = (this->analyze_toclear).sz;
                  } while (lVar7 < iVar8);
                }
                vec<Gluco::Lit>::shrink(local_40,iVar8 - (int)local_38);
                return bVar10;
              }
              pcVar4[iVar8] = '\x01';
              vec<Gluco::Lit>::push(&this->analyze_stack,&local_48);
              vec<Gluco::Lit>::push(local_40,&local_48);
            }
          }
          lVar11 = lVar7 + -2;
          lVar7 = lVar7 + 1;
        } while (lVar11 < (int)puVar2[uVar9 + 1]);
      }
      uVar6 = (this->analyze_stack).sz;
      bVar10 = (int)uVar6 < 1;
    } while (0 < (int)uVar6);
  }
  return bVar10;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear(); analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0){
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause& c = ca[reason(var(analyze_stack.last()))]; analyze_stack.pop();
        if(c.size()==2 && value(c[0])==l_False) {
          assert(value(c[1])==l_True);
          Lit tmp = c[0];
          c[0] =  c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++){
            Lit p  = c[i];
            if (!seen[var(p)] && level(var(p)) > 0){
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0){
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                }else{
                    for (int j = top; j < analyze_toclear.size(); j++)
                        seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}